

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O2

void Au_NtkFree(Au_Ntk_t *p)

{
  Vec_Ptr_t *p_00;
  int *piVar1;
  void **__ptr;
  void *__ptr_00;
  int i;
  int i_00;
  
  Au_ManFree(p->pMan);
  p_00 = p->vChunks;
  if (p_00 != (Vec_Ptr_t *)0x0) {
    for (i_00 = 0; i_00 < p_00->nSize; i_00 = i_00 + 1) {
      __ptr_00 = Vec_PtrEntry(p_00,i_00);
      if ((void *)0x2 < __ptr_00) {
        free(__ptr_00);
      }
    }
    Vec_PtrFree(p_00);
  }
  piVar1 = (p->vCopies).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vCopies).pArray = (int *)0x0;
  }
  __ptr = (p->vPages).pArray;
  if (__ptr != (void **)0x0) {
    free(__ptr);
    (p->vPages).pArray = (void **)0x0;
  }
  piVar1 = (p->vObjs).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vObjs).pArray = (int *)0x0;
  }
  piVar1 = (p->vPis).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vPis).pArray = (int *)0x0;
  }
  piVar1 = (p->vPos).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vPos).pArray = (int *)0x0;
  }
  if (p->pHTable != (int *)0x0) {
    free(p->pHTable);
    p->pHTable = (int *)0x0;
  }
  free(p->pName);
  free(p);
  return;
}

Assistant:

void Au_NtkFree( Au_Ntk_t * p )
{
    Au_ManFree( p->pMan );
    Vec_PtrFreeFree( p->vChunks );
    ABC_FREE( p->vCopies.pArray );
    ABC_FREE( p->vPages.pArray );
    ABC_FREE( p->vObjs.pArray );
    ABC_FREE( p->vPis.pArray );
    ABC_FREE( p->vPos.pArray );
    ABC_FREE( p->pHTable );
    ABC_FREE( p->pName );
    ABC_FREE( p );
}